

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

MQTTErrors mqtt_unsubscribe(mqtt_client *client,char *topic_name)

{
  mqtt_pal_mutex_t *__mutex;
  uint16_t uVar1;
  size_t nbytes;
  mqtt_queued_message *pmVar2;
  MQTTErrors MVar3;
  
  uVar1 = __mqtt_next_pid(client);
  __mutex = &client->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (client->error < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return client->error;
  }
  nbytes = mqtt_pack_unsubscribe_request
                     ((client->mq).curr,(client->mq).curr_sz,(uint)uVar1,topic_name,0);
  if ((long)nbytes < 0) {
LAB_00102d20:
    MVar3 = (MQTTErrors)nbytes;
    client->error = MVar3;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    if (nbytes == 0) {
      mqtt_mq_clean(&client->mq);
      nbytes = mqtt_pack_unsubscribe_request
                         ((client->mq).curr,(client->mq).curr_sz,(uint)uVar1,topic_name,0);
      if ((long)nbytes < 0) goto LAB_00102d20;
      if (nbytes == 0) {
        client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return MQTT_ERROR_SEND_BUFFER_IS_FULL;
      }
    }
    pmVar2 = mqtt_mq_register(&client->mq,nbytes);
    pmVar2->control_type = MQTT_CONTROL_UNSUBSCRIBE;
    pmVar2->packet_id = uVar1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    MVar3 = MQTT_OK;
  }
  return MVar3;
}

Assistant:

enum MQTTErrors mqtt_unsubscribe(struct mqtt_client *client,
                         const char* topic_name)
{
    uint16_t packet_id = __mqtt_next_pid(client);
    ssize_t rv;
    struct mqtt_queued_message *msg;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);

    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(
        rv, msg, client, 
        mqtt_pack_unsubscribe_request(
            client->mq.curr, client->mq.curr_sz,
            packet_id,
            topic_name,
            (const char*)NULL
        ), 
        1
    );
    /* save the control type and packet id of the message */
    msg->control_type = MQTT_CONTROL_UNSUBSCRIBE;
    msg->packet_id = packet_id;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}